

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

BroadcastToLikeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_broadcasttolike(NeuralNetworkLayer *this)

{
  BroadcastToLikeLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x44c) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x44c;
    this_00 = (BroadcastToLikeLayerParams *)operator_new(0x18);
    BroadcastToLikeLayerParams::BroadcastToLikeLayerParams(this_00);
    (this->layer_).broadcasttolike_ = this_00;
  }
  return (BroadcastToLikeLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::BroadcastToLikeLayerParams* NeuralNetworkLayer::mutable_broadcasttolike() {
  if (!has_broadcasttolike()) {
    clear_layer();
    set_has_broadcasttolike();
    layer_.broadcasttolike_ = new ::CoreML::Specification::BroadcastToLikeLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.broadcastToLike)
  return layer_.broadcasttolike_;
}